

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

void __thiscall gl3cts::ReservedNamesTest::deinit(ReservedNamesTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  uint n_so_id;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    if (this->m_so_ids[lVar2] != 0) {
      (**(code **)(CONCAT44(extraout_var,iVar1) + 0x470))();
    }
  }
  return;
}

Assistant:

void ReservedNamesTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int n_so_id = 0; n_so_id < sizeof(m_so_ids) / sizeof(m_so_ids[0]); ++n_so_id)
	{
		const glw::GLuint current_so_id = m_so_ids[n_so_id];

		if (current_so_id != 0)
		{
			gl.deleteShader(current_so_id);
		}
	} /* for (all usedshader object IDs) */
}